

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTOpenGlider.cpp
# Opt level: O1

void __thiscall OpenGliderConnection::APRSMain(OpenGliderConnection *this)

{
  TCPConnection *this_00;
  SOCKET *__pipedes;
  __fd_mask *p_Var1;
  uint uVar2;
  double dVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  ssize_t sVar7;
  NetRuntimeError *pNVar8;
  uint uVar9;
  long lVar10;
  fd_set *pfVar11;
  char *buffer;
  string *psVar12;
  positionTy *ppVar13;
  int __flags;
  int iVar14;
  byte bVar15;
  float _now;
  double local_178;
  string local_170 [2];
  fd_set sRead;
  ThreadSettings TS;
  timeval timeout;
  positionTy currPos;
  timeval *__timeout;
  
  bVar15 = 0;
  ThreadSettings::ThreadSettings(&TS,"LT_OGN_APRS",0x1fbf,"C");
  (this->aprsData)._M_string_length = 0;
  *(this->aprsData)._M_dataplus._M_p = '\0';
  this->aprsLastData = NAN;
  this->aprsLastKeepAlive = 0.0;
  this_00 = &this->tcpAprs;
  p_Var1 = sRead.fds_bits + 2;
  sRead.fds_bits[0] = (__fd_mask)p_Var1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&sRead,"aprs.glidernet.org","");
  XPMP2::SocketNetworking::Connect
            (&this_00->super_SocketNetworking,(string *)&sRead,0x38f4,0x1000,60000);
  if ((__fd_mask *)sRead.fds_bits[0] != p_Var1) {
    operator_delete((void *)sRead.fds_bits[0],sRead.fds_bits[2] + 1);
  }
  iVar14 = (this->tcpAprs).super_SocketNetworking.f_socket;
  __pipedes = this->aprsPipe;
  iVar5 = pipe(__pipedes);
  if (iVar5 < 0) {
    pNVar8 = (NetRuntimeError *)__cxa_allocate_exception(0x50);
    sRead.fds_bits[0] = (__fd_mask)p_Var1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&sRead,"Couldn\'t create pipe","");
    XPMP2::NetRuntimeError::NetRuntimeError(pNVar8,(string *)&sRead);
    __cxa_throw(pNVar8,&XPMP2::NetRuntimeError::typeinfo,XPMP2::NetRuntimeError::~NetRuntimeError);
  }
  fcntl(*__pipedes,4,0x800);
  iVar14 = iVar14 + 1;
  iVar5 = *__pipedes + 1;
  if (*__pipedes + 1 < iVar14) {
    iVar5 = iVar14;
  }
  iVar14 = dataRefs.fdStdDistance * 0x73c;
  DataRefs::GetViewPos();
  pfVar11 = &sRead;
  ppVar13 = &this->aprsPos;
  for (lVar10 = 9; lVar10 != 0; lVar10 = lVar10 + -1) {
    ppVar13->_lat = (double)pfVar11->fds_bits[0];
    pfVar11 = (fd_set *)((long)pfVar11 + ((ulong)bVar15 * -2 + 1) * 8);
    ppVar13 = (positionTy *)((long)ppVar13 + (ulong)bVar15 * -0x10 + 8);
  }
  pfVar11 = &sRead;
  ppVar13 = &currPos;
  for (lVar10 = 9; lVar10 != 0; lVar10 = lVar10 + -1) {
    ppVar13->_lat = (double)pfVar11->fds_bits[0];
    pfVar11 = (fd_set *)((long)pfVar11 + ((ulong)bVar15 * -2 + 1) * 8);
    ppVar13 = (positionTy *)((long)ppVar13 + (ulong)bVar15 * -0x10 + 8);
  }
  bVar4 = APRSDoLogin(this);
  if (!bVar4) {
    (*(this->super_LTFlightDataChannel).super_LTOnlineChannel.super_LTChannel._vptr_LTChannel[7])
              (this,0,1);
  }
  local_178 = (double)(iVar14 / 1000);
  do {
    iVar14 = (*(this->super_LTFlightDataChannel).super_LTOnlineChannel.super_LTChannel.
               _vptr_LTChannel[4])(this);
    if (((byte)iVar14 & (this->tcpAprs).super_SocketNetworking.f_socket != -1) != 1) break;
    dVar3 = CoordDistance(&this->aprsPos,&currPos);
    if (local_178 * 0.2 <= dVar3 / 1000.0) break;
    sRead.fds_bits[0xe] = 0;
    sRead.fds_bits[0xf] = 0;
    sRead.fds_bits[0xc] = 0;
    sRead.fds_bits[0xd] = 0;
    sRead.fds_bits[10] = 0;
    sRead.fds_bits[0xb] = 0;
    sRead.fds_bits[8] = 0;
    sRead.fds_bits[9] = 0;
    sRead.fds_bits[6] = 0;
    sRead.fds_bits[7] = 0;
    sRead.fds_bits[4] = 0;
    sRead.fds_bits[5] = 0;
    sRead.fds_bits[2] = 0;
    sRead.fds_bits[3] = 0;
    sRead.fds_bits[0] = 0;
    sRead.fds_bits[1] = 0;
    iVar14 = (this->tcpAprs).super_SocketNetworking.f_socket;
    iVar6 = iVar14 + 0x3f;
    if (-1 < iVar14) {
      iVar6 = iVar14;
    }
    sRead.fds_bits[iVar6 >> 6] = sRead.fds_bits[iVar6 >> 6] | 1L << ((byte)iVar14 & 0x3f);
    iVar14 = this->aprsPipe[0];
    iVar6 = iVar14 + 0x3f;
    if (-1 < iVar14) {
      iVar6 = iVar14;
    }
    sRead.fds_bits[iVar6 >> 6] = sRead.fds_bits[iVar6 >> 6] | 1L << ((byte)(iVar14 % 0x40) & 0x3f);
    timeout.tv_sec = 0x3c;
    timeout.tv_usec = 0;
    __timeout = (timeval *)&timeout;
    iVar14 = select(iVar5,(fd_set *)&sRead,(fd_set *)0x0,(fd_set *)0x0,__timeout);
    __flags = (int)__timeout;
    iVar6 = (*(this->super_LTFlightDataChannel).super_LTOnlineChannel.super_LTChannel.
              _vptr_LTChannel[4])(this);
    if ((char)iVar6 != '\0') {
      if (iVar14 == 0) {
        pNVar8 = (NetRuntimeError *)__cxa_allocate_exception(0x50);
        local_170[0]._M_dataplus._M_p = (pointer)&local_170[0].field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_170,"\'select\' ran into a timeout","");
        XPMP2::NetRuntimeError::NetRuntimeError(pNVar8,local_170);
        __cxa_throw(pNVar8,&XPMP2::NetRuntimeError::typeinfo,
                    XPMP2::NetRuntimeError::~NetRuntimeError);
      }
      if (iVar14 == -1) {
        pNVar8 = (NetRuntimeError *)__cxa_allocate_exception(0x50);
        local_170[0]._M_dataplus._M_p = (pointer)&local_170[0].field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_170,"\'select\' failed","");
        XPMP2::NetRuntimeError::NetRuntimeError(pNVar8,local_170);
        __cxa_throw(pNVar8,&XPMP2::NetRuntimeError::typeinfo,
                    XPMP2::NetRuntimeError::~NetRuntimeError);
      }
      if (0 < iVar14) {
        uVar2 = (this->tcpAprs).super_SocketNetworking.f_socket;
        uVar9 = uVar2 + 0x3f;
        if (-1 < (int)uVar2) {
          uVar9 = uVar2;
        }
        if (((ulong)sRead.fds_bits[(int)uVar9 >> 6] >> ((ulong)uVar2 & 0x3f) & 1) != 0) {
          sVar7 = XPMP2::SocketNetworking::recv
                            (&this_00->super_SocketNetworking,0,(void *)0x0,
                             sRead.fds_bits[(int)uVar9 >> 6],__flags);
          if (sVar7 < 1) {
            pNVar8 = (NetRuntimeError *)__cxa_allocate_exception(0x50);
            local_170[0]._M_dataplus._M_p = (pointer)&local_170[0].field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_170,"Read no data from TCP socket ","");
            XPMP2::NetRuntimeError::NetRuntimeError(pNVar8,local_170);
            __cxa_throw(pNVar8,&XPMP2::NetRuntimeError::typeinfo,
                        XPMP2::NetRuntimeError::~NetRuntimeError);
          }
          buffer = (this->tcpAprs).super_SocketNetworking.buf;
          if (buffer == (char *)0x0) {
            buffer = "";
          }
          bVar4 = APRSProcessData(this,buffer);
          if (!bVar4) {
            pNVar8 = (NetRuntimeError *)__cxa_allocate_exception(0x50);
            local_170[0]._M_dataplus._M_p = (pointer)&local_170[0].field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_170,"APRSProcessData failed","");
            XPMP2::NetRuntimeError::NetRuntimeError(pNVar8,local_170);
            __cxa_throw(pNVar8,&XPMP2::NetRuntimeError::typeinfo,
                        XPMP2::NetRuntimeError::~NetRuntimeError);
          }
        }
      }
      _now = DataRefs::GetMiscNetwTime(&dataRefs);
      bVar4 = CheckEverySoOften(&this->aprsLastKeepAlive,600.0,_now);
      if (bVar4) {
        APRSSendKeepAlive(this);
      }
      iVar14 = dataRefs.fdStdDistance;
      DataRefs::GetViewPos();
      local_178 = (double)((iVar14 * 0x73c) / 1000);
      psVar12 = local_170;
      ppVar13 = &currPos;
      for (lVar10 = 9; lVar10 != 0; lVar10 = lVar10 + -1) {
        ppVar13->_lat = (double)(psVar12->_M_dataplus)._M_p;
        psVar12 = (string *)((long)psVar12 + ((ulong)bVar15 * -2 + 1) * 8);
        ppVar13 = (positionTy *)((long)ppVar13 + (ulong)bVar15 * -0x10 + 8);
      }
    }
  } while ((char)iVar6 != '\0');
  lVar10 = 0;
  do {
    iVar14 = *(int *)((long)this->aprsPipe + lVar10);
    if (iVar14 != -1) {
      close(iVar14);
    }
    *(undefined4 *)((long)this->aprsPipe + lVar10) = 0xffffffff;
    lVar10 = lVar10 + 4;
  } while (lVar10 != 8);
  XPMP2::TCPConnection::Close(this_00);
  this->aprsLastData = NAN;
  ThreadSettings::~ThreadSettings(&TS);
  return;
}

Assistant:

void OpenGliderConnection::APRSMain ()
{
    // This is a communication thread's main function, set thread's name and C locale
    ThreadSettings TS ("LT_OGN_APRS", LC_ALL_MASK);
    
    try {
        // clear data
        aprsData.clear();
        aprsLastData = NAN;
        aprsLastKeepAlive = 0;
        // open a TCP connection to APRS.glidernet.org
        tcpAprs.Connect(OGN_APRS_SERVER, OGN_APRS_PORT, OGN_APRS_BUF_SIZE, unsigned(OGN_APRS_TIMEOUT_S * 1000));
        int maxSock = (int)tcpAprs.getSocket() + 1;
#if APL == 1 || LIN == 1
        // the self-pipe to shut down the TCP socket gracefully
        if (pipe(aprsPipe) < 0)
            throw XPMP2::NetRuntimeError("Couldn't create pipe");
        fcntl(aprsPipe[0], F_SETFL, O_NONBLOCK);
        maxSock = std::max(maxSock, aprsPipe[0]+1);
#endif
        
        // Login
        double dist_km = dataRefs.GetFdStdDistance_km();
        positionTy currPos = aprsPos = dataRefs.GetViewPos();
        if (!APRSDoLogin()) {
            SetValid(false, true);
        }
        
        // *** Main Loop ***
        while (shallRun() && tcpAprs.isOpen() &&
               // test for camera position not too far away from login's position
               aprsPos.dist(currPos) / M_per_KM < 0.2 * dist_km)
        {
            // wait for some signal on either socket (APRS or self-pipe)
            fd_set sRead;
            FD_ZERO(&sRead);
            FD_SET(tcpAprs.getSocket(), &sRead);     // check our socket
#if APL == 1 || LIN == 1
            FD_SET(aprsPipe[0], &sRead);              // check the self-pipe
#endif
            struct timeval timeout = { OGN_APRS_TIMEOUT_S, 0 };
            int retval = select(maxSock, &sRead, NULL, NULL, &timeout);
            
            // short-cut if we are to shut down (return from 'select' due to closed socket)
            if (!shallRun())
                break;

            // select call failed???
            if (retval == -1)
                throw XPMP2::NetRuntimeError("'select' failed");
            else if (retval == 0)
                throw XPMP2::NetRuntimeError("'select' ran into a timeout");

            // select successful - traffic data
            if (retval > 0 && FD_ISSET(tcpAprs.getSocket(), &sRead))
            {
                // read APRS message
                long rcvdBytes = tcpAprs.recv();
                
                // received something?
                if (rcvdBytes > 0)
                {
                    // have it processed
                    if (!APRSProcessData(tcpAprs.getBuf()))
                        throw XPMP2::NetRuntimeError("APRSProcessData failed");
                }
                else
                    throw XPMP2::NetRuntimeError("Read no data from TCP socket ");
            }

            // Send a keep-alive every 15 minutes
            if (CheckEverySoOften(aprsLastKeepAlive, OGN_APRS_SEND_KEEPALV))
                APRSSendKeepAlive();
            
            // Update position information for test of distance to camera
            dist_km = dataRefs.GetFdStdDistance_km();
            currPos = dataRefs.GetViewPos();
        }
    }
    catch (std::runtime_error& e) {
        LOG_MSG(logERR, ERR_TCP_LISTENACCEPT, ChName(),
                OGN_APRS_SERVER, std::to_string(OGN_APRS_PORT).c_str(),
                e.what());
        // Stop this connection attempt
        if (GetErrCnt() == CH_MAC_ERR_CNT) {         // too bad already?
            bFailoverToHttp = true; // we fail over to the HTTP way of things
            SetValid(true);         // this resets the error count
        } else
            IncErrCnt();
    }
    
#if APL == 1 || LIN == 1
    // close the self-pipe sockets
    for (SOCKET &s: aprsPipe) {
        if (s != INVALID_SOCKET) close(s);
        s = INVALID_SOCKET;
    }
#endif
    
    // make sure the socket is closed
    tcpAprs.Close();
    aprsLastData = NAN;
}